

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O1

string * __thiscall
nite::getTime_abi_cxx11_(string *__return_storage_ptr__,nite *this,uint timeType)

{
  tm *ptVar1;
  char *pcVar2;
  nite *this_00;
  string local_50;
  time_t local_30;
  time_t currentTime;
  
  time(&local_30);
  ptVar1 = localtime(&local_30);
  switch((ulong)this & 0xffffffff) {
  case 0:
    this_00 = (nite *)(ulong)(uint)ptVar1->tm_mday;
    break;
  case 1:
    this_00 = (nite *)(ulong)(uint)ptVar1->tm_mon;
    break;
  case 2:
    this_00 = (nite *)(ulong)(uint)ptVar1->tm_year;
    break;
  case 3:
    this_00 = (nite *)(ulong)(uint)ptVar1->tm_hour;
    break;
  case 4:
    this_00 = (nite *)(ulong)(uint)ptVar1->tm_min;
    break;
  case 5:
    this_00 = (nite *)(ulong)(uint)ptVar1->tm_sec;
    break;
  case 6:
    pcVar2 = ctime(&local_30);
    std::__cxx11::string::string((string *)&local_50,pcVar2,(allocator *)((long)&currentTime + 7));
    strRemoveEndline(__return_storage_ptr__,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_50._M_dataplus._M_p);
    return __return_storage_ptr__;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"NULL","");
    return __return_storage_ptr__;
  }
  toStr_abi_cxx11_(__return_storage_ptr__,this_00,0x247c94);
  return __return_storage_ptr__;
}

Assistant:

String nite::getTime(unsigned timeType){
    time_t currentTime;
    time (&currentTime);
    tm * ptm= localtime(&currentTime);

	switch (timeType){
		case nite::TM::DAY:
			return toStr(ptm->tm_mday);
		break;
		case nite::TM::MONTH:
			return toStr(ptm->tm_mon);
		case nite::TM::YEAR:
			return toStr(ptm->tm_year);
		break;
		case nite::TM::HOURS:
			return toStr(ptm->tm_hour);
		break;
		case nite::TM::MINUTES:
			return toStr(ptm->tm_min);
		break;
		case nite::TM::SECONDS:
			return toStr(ptm->tm_sec);
		break;
		case nite::TM::ALL:
			return nite::strRemoveEndline(ctime(&currentTime));
		break;
	}

	return "NULL";
}